

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O2

void SerializeTransaction<ParamsStream<HashWriter&,TransactionSerParams>,CTransaction>
               (CTransaction *tx,ParamsStream<HashWriter_&,_TransactionSerParams> *s,
               TransactionSerParams *params)

{
  bool bVar1;
  long lVar2;
  pointer pCVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  long in_FS_OFFSET;
  vector<CTxIn,_std::allocator<CTxIn>_> vinDummy;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = params->allow_witness;
  ParamsStream<HashWriter&,TransactionSerParams>::operator<<
            ((ParamsStream<HashWriter&,TransactionSerParams> *)s,&tx->version);
  if ((bVar1 == true) && (tx->m_has_witness == true)) {
    vinDummy.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vinDummy.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vinDummy.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    Serialize<ParamsStream<HashWriter&,TransactionSerParams>,CTxIn,std::allocator<CTxIn>>
              (s,&vinDummy);
    ser_writedata8<ParamsStream<HashWriter&,TransactionSerParams>>(s,'\x01');
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&vinDummy);
    Serialize<ParamsStream<HashWriter&,TransactionSerParams>,CTxIn,std::allocator<CTxIn>>
              (s,&tx->vin);
    Serialize<ParamsStream<HashWriter&,TransactionSerParams>,CTxOut,std::allocator<CTxOut>>
              (s,&tx->vout);
    lVar5 = 0x50;
    for (uVar4 = 0;
        pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar4 < (ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pCVar3) / 0x68);
        uVar4 = uVar4 + 1) {
      Serialize<ParamsStream<HashWriter&,TransactionSerParams>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (s,(vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)((long)&(pCVar3->prevout).hash + lVar5));
      lVar5 = lVar5 + 0x68;
    }
  }
  else {
    Serialize<ParamsStream<HashWriter&,TransactionSerParams>,CTxIn,std::allocator<CTxIn>>
              (s,&tx->vin);
    Serialize<ParamsStream<HashWriter&,TransactionSerParams>,CTxOut,std::allocator<CTxOut>>
              (s,&tx->vout);
  }
  ParamsStream<HashWriter&,TransactionSerParams>::operator<<
            ((ParamsStream<HashWriter&,TransactionSerParams> *)s,&tx->nLockTime);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeTransaction(const TxType& tx, Stream& s, const TransactionSerParams& params)
{
    const bool fAllowWitness = params.allow_witness;

    s << tx.version;
    unsigned char flags = 0;
    // Consistency check
    if (fAllowWitness) {
        /* Check whether witnesses need to be serialized. */
        if (tx.HasWitness()) {
            flags |= 1;
        }
    }
    if (flags) {
        /* Use extended format in case witnesses are to be serialized. */
        std::vector<CTxIn> vinDummy;
        s << vinDummy;
        s << flags;
    }
    s << tx.vin;
    s << tx.vout;
    if (flags & 1) {
        for (size_t i = 0; i < tx.vin.size(); i++) {
            s << tx.vin[i].scriptWitness.stack;
        }
    }
    s << tx.nLockTime;
}